

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenArrayNewSetSize(BinaryenExpressionRef expr,BinaryenExpressionRef sizeExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef sizeExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::ArrayNew>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<ArrayNew>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x10c5,
                  "void BinaryenArrayNewSetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (sizeExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)sizeExpr;
    return;
  }
  __assert_fail("sizeExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x10c6,"void BinaryenArrayNewSetSize(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenArrayNewSetSize(BinaryenExpressionRef expr,
                             BinaryenExpressionRef sizeExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayNew>());
  assert(sizeExpr);
  static_cast<ArrayNew*>(expression)->size = (Expression*)sizeExpr;
}